

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

void __thiscall Imath_3_2::Matrix33<double>::Matrix33(Matrix33<double> *this,Matrix33<double> *v)

{
  Matrix33<double> *v_local;
  Matrix33<double> *this_local;
  
  this->x[0][0] = v->x[0][0];
  this->x[0][1] = v->x[0][1];
  this->x[0][2] = v->x[0][2];
  this->x[1][0] = v->x[1][0];
  this->x[1][1] = v->x[1][1];
  this->x[1][2] = v->x[1][2];
  this->x[2][0] = v->x[2][0];
  this->x[2][1] = v->x[2][1];
  this->x[2][2] = v->x[2][2];
  return;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline Matrix33<T>::Matrix33 (
    const Matrix33& v) IMATH_NOEXCEPT
{
    // Function calls and aliasing issues can inhibit vectorization versus
    // straight assignment of data members, so instead of this:
    //     memcpy (x, v.x, sizeof (x));
    // we do this:
    x[0][0] = v.x[0][0];
    x[0][1] = v.x[0][1];
    x[0][2] = v.x[0][2];
    x[1][0] = v.x[1][0];
    x[1][1] = v.x[1][1];
    x[1][2] = v.x[1][2];
    x[2][0] = v.x[2][0];
    x[2][1] = v.x[2][1];
    x[2][2] = v.x[2][2];
}